

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall
lodepng::ExtractZlib::inflateHuffmanBlock
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uchar *in,
          size_t *bp,size_t *pos,size_t inlength,unsigned_long btype)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ExtractZlib *pEVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  long lVar8;
  ExtractZlib *pEVar9;
  reference pvVar10;
  reference pvVar11;
  ulong *in_RCX;
  ExtractZlib *in_RSI;
  size_t *in_RDI;
  ulong *in_R8;
  ulong in_R9;
  long in_stack_00000008;
  size_t i;
  size_t back;
  size_t start;
  unsigned_long numextrabitsD;
  unsigned_long dist;
  unsigned_long codeD;
  size_t numextrabits;
  size_t length;
  unsigned_long code;
  size_t numlen;
  size_t numlit;
  size_t numcodes;
  size_t in_stack_00000128;
  size_t *in_stack_00000130;
  uchar *in_stack_00000138;
  HuffmanTree *in_stack_00000140;
  HuffmanTree *in_stack_00000148;
  ExtractZlib *in_stack_00000150;
  value_type_conflict4 *in_stack_ffffffffffffff18;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *in_stack_ffffffffffffff20
  ;
  undefined4 in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff2c;
  value_type in_stack_ffffffffffffff30;
  value_type in_stack_ffffffffffffff34;
  value_type in_stack_ffffffffffffff38;
  value_type in_stack_ffffffffffffff3c;
  ExtractZlib *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff50;
  ExtractZlib *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *local_48;
  size_t local_40;
  
  local_40 = 0;
  local_48 = (vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_> *)0x0;
  if (in_stack_00000008 == 1) {
    generateFixedTrees((ExtractZlib *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (HuffmanTree *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (HuffmanTree *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
    ;
  }
  else if ((in_stack_00000008 == 2) &&
          (getTreeInflateDynamic
                     (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                      in_stack_00000130,in_stack_00000128), (int)in_RDI[1] != 0)) {
    return;
  }
  while( true ) {
    do {
      while( true ) {
        uVar5 = huffmanDecodeSymbol(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI,
                                    (HuffmanTree *)in_stack_ffffffffffffff40,
                                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if ((int)in_RDI[1] != 0) {
          return;
        }
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
                  (in_stack_ffffffffffffff20);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
        if (uVar5 == 0x100) {
          pvVar11 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::
                    back(in_stack_ffffffffffffff20);
          pvVar11->numlit = local_40;
          pvVar11 = std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::
                    back(local_48);
          pvVar11->numlen = (size_t)local_48;
          return;
        }
        if (0xff < uVar5) break;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_ffffffffffffff20,(value_type_conflict1 *)in_stack_ffffffffffffff18);
        *in_R8 = *in_R8 + 1;
        local_40 = local_40 + 1;
      }
    } while ((uVar5 < 0x101) || (0x11d < uVar5));
    lVar1 = *(long *)(LENBASE + (uVar5 - 0x101) * 8);
    uVar2 = *(undefined8 *)(LENEXTRA + (uVar5 - 0x101) * 8);
    if (in_R9 <= *in_RCX >> 3) {
      *(undefined4 *)(in_RDI + 1) = 0x33;
      return;
    }
    uVar5 = readBitsFromStream(in_stack_ffffffffffffff40,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    uVar6 = huffmanDecodeSymbol(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI,
                                (HuffmanTree *)in_stack_ffffffffffffff40,
                                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((int)in_RDI[1] != 0) break;
    if (0x1d < uVar6) {
      *(undefined4 *)(in_RDI + 1) = 0x12;
      return;
    }
    lVar8 = *(long *)(DISTBASE + uVar6 * 8);
    uVar3 = *(undefined8 *)(DISTEXTRA + uVar6 * 8);
    if (in_R9 <= *in_RCX >> 3) {
      *(undefined4 *)(in_RDI + 1) = 0x33;
      return;
    }
    uVar7 = readBitsFromStream(in_stack_ffffffffffffff40,
                               (size_t *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               (uchar *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30
                                                ),
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    lVar8 = uVar7 + lVar8;
    pEVar4 = (ExtractZlib *)*in_R8;
    in_stack_ffffffffffffff58 = (ExtractZlib *)((long)pEVar4 - lVar8);
    for (in_stack_ffffffffffffff50 = (uchar *)0x0;
        in_stack_ffffffffffffff50 < (uchar *)(uVar5 + lVar1);
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 + 1) {
      pEVar9 = (ExtractZlib *)((long)&in_stack_ffffffffffffff58->zlibinfo + 1);
      in_stack_ffffffffffffff40 = in_RSI;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,
                 (size_type)in_stack_ffffffffffffff58);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      *in_R8 = *in_R8 + 1;
      if (pEVar4 <= pEVar9) {
        pEVar9 = (ExtractZlib *)((long)pEVar4 - lVar8);
      }
      in_stack_ffffffffffffff58 = pEVar9;
    }
    local_48 = local_48 + 1;
    in_stack_ffffffffffffff2c = (value_type)uVar6;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
              (in_stack_ffffffffffffff20);
    pvVar10 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    *pvVar10 = in_stack_ffffffffffffff2c;
    in_stack_ffffffffffffff30 = (value_type)uVar2;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
              (in_stack_ffffffffffffff20);
    pvVar10 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    *pvVar10 = in_stack_ffffffffffffff30;
    in_stack_ffffffffffffff34 = (value_type)uVar3;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
              (in_stack_ffffffffffffff20);
    pvVar10 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    *pvVar10 = in_stack_ffffffffffffff34;
    in_stack_ffffffffffffff38 = (value_type)(uchar *)(uVar5 + lVar1);
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
              (in_stack_ffffffffffffff20);
    pvVar10 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    *pvVar10 = in_stack_ffffffffffffff38;
    in_stack_ffffffffffffff3c = (value_type)lVar8;
    std::vector<lodepng::ZlibBlockInfo,_std::allocator<lodepng::ZlibBlockInfo>_>::back
              (in_stack_ffffffffffffff20);
    pvVar10 = std::vector<int,_std::allocator<int>_>::back
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
    *pvVar10 = in_stack_ffffffffffffff3c;
  }
  return;
}

Assistant:

void inflateHuffmanBlock(std::vector<unsigned char>& out,
                           const unsigned char* in, size_t& bp, size_t& pos, size_t inlength, unsigned long btype) {
    size_t numcodes = 0, numlit = 0, numlen = 0; //for logging
    if(btype == 1) { generateFixedTrees(codetree, codetreeD); }
    else if(btype == 2) { getTreeInflateDynamic(codetree, codetreeD, in, bp, inlength); if(error) return; }
    for(;;) {
      unsigned long code = huffmanDecodeSymbol(in, bp, codetree, inlength); if(error) return;
      numcodes++;
      zlibinfo->back().lz77_lcode.push_back(code); //output code
      zlibinfo->back().lz77_dcode.push_back(0);
      zlibinfo->back().lz77_lbits.push_back(0);
      zlibinfo->back().lz77_dbits.push_back(0);
      zlibinfo->back().lz77_lvalue.push_back(0);
      zlibinfo->back().lz77_dvalue.push_back(0);

      if(code == 256) {
        break; //end code
      } else if(code <= 255) { //literal symbol
        out.push_back((unsigned char)(code));
        pos++;
        numlit++;
      } else if(code >= 257 && code <= 285) { //length code
        size_t length = LENBASE[code - 257], numextrabits = LENEXTRA[code - 257];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        length += readBitsFromStream(bp, in, numextrabits);
        unsigned long codeD = huffmanDecodeSymbol(in, bp, codetreeD, inlength); if(error) return;
        if(codeD > 29) { error = 18; return; } //error: invalid dist code (30-31 are never used)
        unsigned long dist = DISTBASE[codeD], numextrabitsD = DISTEXTRA[codeD];
        if((bp >> 3) >= inlength) { error = 51; return; } //error, bit pointer will jump past memory
        dist += readBitsFromStream(bp, in, numextrabitsD);
        size_t start = pos, back = start - dist; //backwards
        for(size_t i = 0; i < length; i++) {
          out.push_back(out[back++]);
          pos++;
          if(back >= start) back = start - dist;
        }
        numlen++;
        zlibinfo->back().lz77_dcode.back() = codeD; //output distance code
        zlibinfo->back().lz77_lbits.back() = numextrabits; //output length extra bits
        zlibinfo->back().lz77_dbits.back() = numextrabitsD; //output dist extra bits
        zlibinfo->back().lz77_lvalue.back() = length; //output length
        zlibinfo->back().lz77_dvalue.back() = dist; //output dist
      }
    }
    zlibinfo->back().numlit = numlit; //output number of literal symbols
    zlibinfo->back().numlen = numlen; //output number of length symbols
  }